

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O3

void __thiscall
glcts::anon_unknown_0::SubRoutineLocArraysMix::~SubRoutineLocArraysMix(SubRoutineLocArraysMix *this)

{
  deqp::SubcaseBase::~SubcaseBase((SubcaseBase *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

virtual long Run()
	{
		//subroutine vec4 st0(float param);
		//subroutine(st0) vec4 sf0(float param) { .... };
		//subroutine(st0) vec4 sf1(float param) { .... };
		SubroutineFunctionSet functions_st0(uniformValueGenerator, 2);

		//subroutine vec4 st1(float param);
		//subroutine(st1) vec4 sf2(float param) { .... };
		//subroutine(st1) vec4 sf3(float param) { .... };
		SubroutineFunctionSet functions_st1(uniformValueGenerator, 2);

		std::vector<SubroutineUniform> subroutineUniforms;

		//layout(location = 1) subroutine uniform st0 u0[2];
		subroutineUniforms.push_back(SubroutineUniform(uniformValueGenerator, functions_st0, Loc::C(1), 2));

		////layout(location = 3) subroutine uniform st0 u1[2][3];
		std::vector<int> arraySizesSegmented(2);
		arraySizesSegmented[0] = 2;
		arraySizesSegmented[1] = 3;
		subroutineUniforms.push_back(
			SubroutineUniform(uniformValueGenerator, functions_st0, Loc::C(3), arraySizesSegmented));

		//layout(location = 9) subroutine uniform st1 u2;
		subroutineUniforms.push_back(SubroutineUniform(uniformValueGenerator, functions_st1, Loc::C(9)));

		return doRun(subroutineUniforms);
	}